

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_2c58d::FailingLogger::error(FailingLogger *this,string *msg)

{
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  AssertHelper local_18;
  
  testing::Message::Message((Message *)&local_20);
  std::operator<<((ostream *)(local_20._M_head_impl + 0x10),"error: ");
  std::operator<<((ostream *)(local_20._M_head_impl + 0x10),(string *)msg);
  testing::internal::AssertHelper::AssertHelper
            (&local_18,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
             ,0xff,"Failed");
  testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_20);
  testing::internal::AssertHelper::~AssertHelper(&local_18);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return;
}

Assistant:

virtual void error(const std::string &msg) { FAIL() << "error: " << msg; }